

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SudokuGitter.cpp
# Opt level: O0

void __thiscall SudokuGitter::SudokuGitter(SudokuGitter *this,uint elements)

{
  uint uVar1;
  ostream *poVar2;
  __type _Var3;
  allocator<std::vector<cell,_std::allocator<cell>_>_> local_45 [20];
  allocator<cell> local_31;
  vector<cell,_std::allocator<cell>_> local_30;
  uint local_14;
  SudokuGitter *pSStack_10;
  uint elements_local;
  SudokuGitter *this_local;
  
  local_14 = elements;
  pSStack_10 = this;
  std::allocator<cell>::allocator(&local_31);
  std::vector<cell,_std::allocator<cell>_>::vector(&local_30,(ulong)elements,&local_31);
  std::allocator<std::vector<cell,_std::allocator<cell>_>_>::allocator(local_45);
  std::
  vector<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
  ::vector(&this->cells,(ulong)elements,&local_30,local_45);
  std::allocator<std::vector<cell,_std::allocator<cell>_>_>::~allocator(local_45);
  std::vector<cell,_std::allocator<cell>_>::~vector(&local_30);
  std::allocator<cell>::~allocator(&local_31);
  uVar1 = local_14;
  this->elements = local_14;
  _Var3 = std::sqrt<unsigned_int>(local_14);
  this->quadWidth = (uint)((ulong)uVar1 / ((long)_Var3 & 0xffffffffU));
  _Var3 = std::sqrt<unsigned_int>(local_14);
  this->quadHeight = (uint)(long)_Var3;
  poVar2 = std::operator<<((ostream *)&std::cout,"Create sudoku with: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_14);
  poVar2 = std::operator<<(poVar2," elements.");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"quad height: ");
  uVar1 = getQuadHeight(this);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,uVar1);
  poVar2 = std::operator<<(poVar2," quad width:");
  uVar1 = getQuadWidth(this);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,uVar1);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

SudokuGitter::SudokuGitter(const unsigned int elements) : elements(elements),
                                                          cells(elements, vector<cell>(elements)),
                                                          quadHeight(static_cast<const unsigned int>(std::sqrt(
                                                                  elements))),
                                                          quadWidth(
                                                                  elements / static_cast<const unsigned int>(std::sqrt(
                                                                          elements))) {
    cout << "Create sudoku with: " << elements << " elements." << endl;
    cout << "quad height: " << getQuadHeight() << " quad width:" << getQuadWidth() << endl;
}